

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O0

void __thiscall antlr::CommonAST::initialize(CommonAST *this,RefToken *t)

{
  int iVar1;
  Token *pTVar2;
  TokenRefCount<antlr::Token> *in_RSI;
  long *in_RDI;
  string local_30 [48];
  
  pTVar2 = TokenRefCount<antlr::Token>::operator->(in_RSI);
  iVar1 = (*pTVar2->_vptr_Token[6])();
  (**(code **)(*in_RDI + 0xb8))(in_RDI,iVar1);
  pTVar2 = TokenRefCount<antlr::Token>::operator->(in_RSI);
  (*pTVar2->_vptr_Token[4])();
  (**(code **)(*in_RDI + 0xb0))(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void initialize( RefToken t )
	{
		setType(t->getType());
		setText(t->getText());
	}